

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

QuantizationParams * __thiscall
CoreML::Specification::WeightParams::_internal_mutable_quantization(WeightParams *this)

{
  ulong uVar1;
  QuantizationParams *pQVar2;
  Arena *arena;
  
  if (this->quantization_ != (QuantizationParams *)0x0) {
    return this->quantization_;
  }
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    arena = *(Arena **)arena;
  }
  pQVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::QuantizationParams>
                     (arena);
  this->quantization_ = pQVar2;
  return pQVar2;
}

Assistant:

inline ::CoreML::Specification::QuantizationParams* WeightParams::_internal_mutable_quantization() {
  
  if (quantization_ == nullptr) {
    auto* p = CreateMaybeMessage<::CoreML::Specification::QuantizationParams>(GetArenaForAllocation());
    quantization_ = p;
  }
  return quantization_;
}